

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O0

void tabosc4_tilde_set(t_tabosc4_tilde *x,t_symbol *s)

{
  int iVar1;
  int iVar2;
  uint local_28;
  int local_24;
  int pointsinarray;
  int npoints;
  _garray *a;
  t_symbol *s_local;
  t_tabosc4_tilde *x_local;
  
  x->x_arrayname = s;
  a = (_garray *)s;
  s_local = (t_symbol *)x;
  _pointsinarray = (_garray *)pd_findbyclass(x->x_arrayname,garray_class);
  if (_pointsinarray == (_garray *)0x0) {
    if (*(char *)&((a->x_gobj).g_pd)->c_name != '\0') {
      pd_error(s_local,"tabosc4~: %s: no such array",(s_local[2].s_next)->s_name);
    }
    s_local[2].s_thing = (_class **)0x0;
  }
  else {
    iVar1 = garray_getfloatwords(_pointsinarray,(int *)&local_28,(t_word **)&s_local[2].s_thing);
    if (iVar1 == 0) {
      pd_error(s_local,"%s: bad template for tabosc4~",(s_local[2].s_next)->s_name);
      s_local[2].s_thing = (_class **)0x0;
    }
    else {
      iVar1 = local_28 - 3;
      local_24 = iVar1;
      iVar2 = ilog2(local_28 - 3);
      if (iVar1 == 1 << ((byte)iVar2 & 0x1f)) {
        *(float *)&s_local[2].s_name = (float)local_24;
        *(float *)((long)&s_local[2].s_name + 4) = 1.0 / (float)local_24;
        garray_usedindsp(_pointsinarray);
      }
      else {
        pd_error(s_local,"%s: number of points (%d) not a power of 2 plus three",
                 (s_local[2].s_next)->s_name,(ulong)local_28);
        s_local[2].s_thing = (_class **)0x0;
        garray_usedindsp(_pointsinarray);
      }
    }
  }
  return;
}

Assistant:

static void tabosc4_tilde_set(t_tabosc4_tilde *x, t_symbol *s)
{
    t_garray *a;
    int npoints, pointsinarray;

    x->x_arrayname = s;
    if (!(a = (t_garray *)pd_findbyclass(x->x_arrayname, garray_class)))
    {
        if (*s->s_name)
            pd_error(x, "tabosc4~: %s: no such array", x->x_arrayname->s_name);
        x->x_vec = 0;
    }
    else if (!garray_getfloatwords(a, &pointsinarray, &x->x_vec))
    {
        pd_error(x, "%s: bad template for tabosc4~", x->x_arrayname->s_name);
        x->x_vec = 0;
    }
    else if ((npoints = pointsinarray - 3) != (1 << ilog2(pointsinarray - 3)))
    {
        pd_error(x, "%s: number of points (%d) not a power of 2 plus three",
            x->x_arrayname->s_name, pointsinarray);
        x->x_vec = 0;
        garray_usedindsp(a);
    }
    else
    {
        x->x_fnpoints = npoints;
        x->x_finvnpoints = 1./npoints;
        garray_usedindsp(a);
    }
}